

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O2

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeCylinderMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3D *paVar1;
  uint pnt_1;
  long lVar2;
  uint pnt;
  ulong uVar3;
  float fVar4;
  float fVar5;
  aiVector3t<float> aVar6;
  aiVector3D local_98;
  aiVector3D local_88;
  aiVector3D local_78;
  aiMatrix4x4 mTrafo;
  
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 0.0;
  fVar4 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_x);
  if (0.95 <= fVar4) {
    FindMeshCenter(mesh,&local_98,&local_88,&local_78);
    fVar4 = local_78.x - local_88.x;
    lVar2 = 4;
    for (uVar3 = 0; uVar3 < mesh->mNumVertices; uVar3 = uVar3 + 1) {
      paVar1 = mesh->mVertices;
      *(float *)((long)&out->x + lVar2) =
           (*(float *)((long)paVar1 + lVar2 + -4) - local_88.x) / fVar4;
      fVar5 = atan2f(*(float *)((long)&paVar1->y + lVar2) - local_98.z,
                     *(float *)((long)&paVar1->x + lVar2) - local_98.y);
      *(float *)((long)out + lVar2 + -4) = (fVar5 + 3.1415927) / 6.2831855;
      lVar2 = lVar2 + 0xc;
    }
  }
  else {
    fVar4 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y);
    if (0.95 <= fVar4) {
      FindMeshCenter(mesh,&local_98,&local_88,&local_78);
      fVar4 = local_78.y - local_88.y;
      lVar2 = 4;
      for (uVar3 = 0; uVar3 < mesh->mNumVertices; uVar3 = uVar3 + 1) {
        paVar1 = mesh->mVertices;
        *(float *)((long)&out->x + lVar2) =
             (*(float *)((long)&paVar1->x + lVar2) - local_88.y) / fVar4;
        fVar5 = atan2f(*(float *)((long)paVar1 + lVar2 + -4) - local_98.x,
                       *(float *)((long)&paVar1->y + lVar2) - local_98.z);
        *(float *)((long)out + lVar2 + -4) = (fVar5 + 3.1415927) / 6.2831855;
        lVar2 = lVar2 + 0xc;
      }
    }
    else {
      fVar4 = operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_z);
      if (0.95 <= fVar4) {
        FindMeshCenter(mesh,&local_98,&local_88,&local_78);
        fVar4 = local_78.z - local_88.z;
        lVar2 = 4;
        for (uVar3 = 0; uVar3 < mesh->mNumVertices; uVar3 = uVar3 + 1) {
          paVar1 = mesh->mVertices;
          *(float *)((long)&out->x + lVar2) =
               (*(float *)((long)&paVar1->y + lVar2) - local_88.z) / fVar4;
          fVar5 = atan2f(*(float *)((long)&paVar1->x + lVar2) - local_98.y,
                         *(float *)((long)paVar1 + lVar2 + -4) - local_98.x);
          *(float *)((long)out + lVar2 + -4) = (fVar5 + 3.1415927) / 6.2831855;
          lVar2 = lVar2 + 0xc;
        }
      }
      else {
        mTrafo.a1 = 1.0;
        mTrafo.a2 = 0.0;
        mTrafo.a3 = 0.0;
        mTrafo.a4 = 0.0;
        mTrafo.b1 = 0.0;
        mTrafo.b2 = 1.0;
        mTrafo.b3 = 0.0;
        mTrafo.b4 = 0.0;
        mTrafo.c1 = 0.0;
        mTrafo.c2 = 0.0;
        mTrafo.c3 = 1.0;
        mTrafo.c4 = 0.0;
        mTrafo.d1 = 0.0;
        mTrafo.d2 = 0.0;
        mTrafo.d3 = 0.0;
        mTrafo.d4 = 1.0;
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y,&mTrafo);
        FindMeshCenterTransformed(mesh,&local_98,&local_88,&local_78,&mTrafo);
        fVar4 = local_78.y - local_88.y;
        lVar2 = 0;
        for (uVar3 = 0; uVar3 < mesh->mNumVertices; uVar3 = uVar3 + 1) {
          aVar6 = operator*(&mTrafo,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar2));
          *(float *)((long)&out->y + lVar2) = (aVar6.y - local_88.y) / fVar4;
          fVar5 = atan2f(aVar6.x - local_98.x,aVar6.z - local_98.z);
          *(float *)((long)&out->x + lVar2) = (fVar5 + 3.1415927) / 6.2831855;
          lVar2 = lVar2 + 0xc;
        }
      }
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

ComputeUVMappingProcess::~ComputeUVMappingProcess()
{
    // nothing to do here
}